

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

TRef lj_ir_knumint(jit_State *J,lua_Number n)

{
  TRef TVar1;
  cTValue *tv;
  
  if ((((double)(int)n == n) && (!NAN((double)(int)n) && !NAN(n))) &&
     ((int)n != 0 || (ulong)n >> 0x20 == 0)) {
    TVar1 = lj_ir_kint(J,(int)n);
    return TVar1;
  }
  tv = lj_ir_k64_find(J,(uint64_t)n);
  TVar1 = lj_ir_k64(J,IR_KNUM,tv);
  return TVar1;
}

Assistant:

TRef lj_ir_knumint(jit_State *J, lua_Number n)
{
  int32_t k;
  if (numistrueint(n, &k))
    return lj_ir_kint(J, k);
  else
    return lj_ir_knum(J, n);
}